

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExprWriter.cpp
# Opt level: O0

void __thiscall ExprWriter::visit(ExprWriter *this,ExprList *exprList)

{
  bool bVar1;
  reference ppEVar2;
  ostream *this_00;
  long in_RSI;
  ExprWriter *in_RDI;
  Expr **expr;
  iterator __end1;
  iterator __begin1;
  vector<Expr_*,_std::allocator<Expr_*>_> *__range1;
  bool first;
  vector<Expr_*,_std::allocator<Expr_*>_> *in_stack_ffffffffffffffb8;
  __normal_iterator<Expr_**,_std::vector<Expr_*,_std::allocator<Expr_*>_>_> local_28;
  long local_20;
  byte local_11;
  
  local_11 = 1;
  local_20 = in_RSI + 0x18;
  local_28._M_current =
       (Expr **)std::vector<Expr_*,_std::allocator<Expr_*>_>::begin(in_stack_ffffffffffffffb8);
  std::vector<Expr_*,_std::allocator<Expr_*>_>::end(in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<Expr_**,_std::vector<Expr_*,_std::allocator<Expr_*>_>_> *)
                       in_RDI,(__normal_iterator<Expr_**,_std::vector<Expr_*,_std::allocator<Expr_*>_>_>
                               *)in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    ppEVar2 = __gnu_cxx::__normal_iterator<Expr_**,_std::vector<Expr_*,_std::allocator<Expr_*>_>_>::
              operator*(&local_28);
    if ((local_11 & 1) == 0) {
      indent(in_RDI);
    }
    local_11 = 0;
    (*(*ppEVar2)->_vptr_Expr[2])(*ppEVar2,in_RDI);
    bVar1 = llvm::isa<IfExpr,Expr*>((Expr **)0x2a84e3);
    if (!bVar1) {
      bVar1 = llvm::isa<SwitchExpr,Expr*>((Expr **)0x2a84f1);
      if (!bVar1) {
        bVar1 = llvm::isa<ExprList,Expr*>((Expr **)0x2a84ff);
        if (!bVar1) {
          this_00 = std::operator<<(in_RDI->ss,";");
          std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
        }
      }
    }
    __gnu_cxx::__normal_iterator<Expr_**,_std::vector<Expr_*,_std::allocator<Expr_*>_>_>::operator++
              (&local_28);
  }
  return;
}

Assistant:

void ExprWriter::visit(ExprList& exprList) {
    bool first = true;
    for (const auto& expr : exprList.expressions) {
        if (!first)
            indent();
        first = false;
        expr->accept(*this);
        if (!llvm::isa<IfExpr>(expr) && !llvm::isa<SwitchExpr>(expr) && !llvm::isa<ExprList>(expr)) {
            ss << ";" << std::endl;
        }
    }
}